

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6295.c
# Opt level: O2

void okim6295_update(void *info,UINT32 samples,DEV_SMPL **outputs)

{
  size_t __n;
  DEV_SMPL *pDVar1;
  byte bVar2;
  INT16 IVar3;
  uint uVar4;
  oki_adpcm_state *adpcm;
  long lVar5;
  ulong uVar6;
  
  __n = (ulong)samples * 4;
  lVar5 = 0;
  memset(*outputs,0,__n);
  do {
    if (lVar5 == 4) {
      memcpy(outputs[1],*outputs,__n);
      return;
    }
    if ((*(char *)((long)info + lVar5 * 0x30 + 0x20) != '\0') &&
       (adpcm = (oki_adpcm_state *)((long)info + lVar5 * 0x30 + 8),
       *(char *)((long)&adpcm[1].diff_lookup + 4) == '\0')) {
      pDVar1 = *outputs;
      uVar6 = 0;
      do {
        if (samples == uVar6) goto LAB_00159042;
        uVar4 = *(uint *)&adpcm[1].index_shift;
        bVar2 = memory_raw_read_byte
                          ((okim6295_state *)info,(uVar4 >> 1) + *(int *)&adpcm[1].field_0x4);
        IVar3 = oki_adpcm_clock(adpcm,bVar2 >> (~(byte)(uVar4 << 2) & 4));
        pDVar1[uVar6] = pDVar1[uVar6] + ((int)IVar3 * *(int *)&adpcm[1].diff_lookup) / 2;
        uVar4 = *(int *)&adpcm[1].index_shift + 1;
        *(uint *)&adpcm[1].index_shift = uVar4;
        uVar6 = uVar6 + 1;
      } while (uVar4 < *(uint *)((long)&adpcm[1].index_shift + 4));
      *(undefined1 *)&adpcm[1].signal = 0;
    }
LAB_00159042:
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

static void okim6295_update(void* info, UINT32 samples, DEV_SMPL** outputs)
{
	okim6295_state *chip = (okim6295_state *)info;
	int i;

	// reset the output stream
	memset(outputs[0], 0, samples * sizeof(*outputs[0]));

	// iterate over voices and accumulate sample data
	for (i = 0; i < OKIM6295_VOICES; i++)
		generate_adpcm(chip, &chip->voice[i], outputs[0], samples);

	memcpy(outputs[1], outputs[0], samples * sizeof(*outputs[0]));
}